

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::OpenPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  int iVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  long lVar4;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  ppPVar2 = (polytree->AllNodes).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar1 = (int)((ulong)((long)(polytree->AllNodes).
                              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2) >> 3);
  if (0 < iVar1) {
    iVar1 = iVar1 - (uint)(*(polytree->super_PolyNode).Childs.
                            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != *ppPVar2);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar1);
  ppPVar2 = (polytree->super_PolyNode).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (polytree->super_PolyNode).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppPVar3 - (long)ppPVar2) >> 3)) {
    lVar4 = 0;
    do {
      if (ppPVar2[lVar4]->m_IsOpen == true) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(paths,&ppPVar2[lVar4]->Contour);
        ppPVar2 = (polytree->super_PolyNode).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar3 = (polytree->super_PolyNode).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)ppPVar3 - (long)ppPVar2) >> 3));
  }
  return;
}

Assistant:

void OpenPathsFromPolyTree(PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  //Open paths are top level only, so ...
  for (int i = 0; i < polytree.ChildCount(); ++i)
    if (polytree.Childs[i]->IsOpen())
      paths.push_back(polytree.Childs[i]->Contour);
}